

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O1

void __thiscall
PointerBasedIterator_PreIncrement_Test::~PointerBasedIterator_PreIncrement_Test
          (PointerBasedIterator_PreIncrement_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, PreIncrement) {
    std::array<int, 2> arr{{1, 3}};
    int y = 1;
    int * x = &y;
    iterator it{x};
    int * a = &arr[0];
    iterator i{a};
    EXPECT_EQ (*i, 1);
    EXPECT_EQ (++i, iterator{&arr[1]});
    EXPECT_EQ (*i, 3);
    EXPECT_EQ (++i, iterator{&arr[0] + 2});
}